

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  size_type __n;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> input_vector;
  int index;
  istream *stream_for_input;
  ostringstream error_message_6;
  ifstream ifs2;
  istream *stream_for_index;
  ostringstream error_message_5;
  ifstream ifs1;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int num_input_files;
  char *input_file;
  char *index_file;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int codebook_index;
  int vector_length;
  option *in_stack_ffffffffffffecb8;
  istream *in_stack_ffffffffffffecc0;
  string *in_stack_ffffffffffffecc8;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffecd0;
  undefined1 in_stack_ffffffffffffecd4;
  undefined1 in_stack_ffffffffffffecd5;
  undefined1 in_stack_ffffffffffffecd6;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffecd7;
  ostream *in_stack_ffffffffffffece0;
  vector<double,_std::allocator<double>_> *this;
  char *local_1318;
  undefined7 in_stack_ffffffffffffecf0;
  istream *in_stack_ffffffffffffecf8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffed00;
  int in_stack_ffffffffffffed08;
  int in_stack_ffffffffffffed0c;
  char *in_stack_ffffffffffffed10;
  int *in_stack_ffffffffffffed20;
  bool local_127a;
  bool local_124a;
  bool local_1222;
  allocator local_1201;
  string local_1200 [32];
  ostringstream local_11e0 [136];
  ostringstream *in_stack_ffffffffffffeea8;
  string *in_stack_ffffffffffffeeb0;
  vector<double,_std::allocator<double>_> local_1061;
  int local_1044;
  char *local_1040;
  allocator local_1031;
  string local_1030 [32];
  ostringstream local_1010 [376];
  char local_e98 [520];
  char *local_c90;
  undefined4 local_c88;
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  char local_ae8 [527];
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [383];
  allocator local_739;
  string local_738 [32];
  ostringstream local_718 [380];
  int local_59c;
  char *local_598;
  char *local_590;
  allocator local_581;
  string local_580 [32];
  ostringstream local_560 [383];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x1a;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_1c = ya_getopt_long(CONCAT13(in_stack_ffffffffffffecd7,
                                            CONCAT12(in_stack_ffffffffffffecd6,
                                                     CONCAT11(in_stack_ffffffffffffecd5,
                                                              in_stack_ffffffffffffecd4))),
                                   (char **)in_stack_ffffffffffffecc8,
                                   (char *)in_stack_ffffffffffffecc0,in_stack_ffffffffffffecb8,
                                   (int *)0x1036ca), pcVar1 = ya_optarg, local_1c != -1) {
    switch(local_1c) {
    case 0x68:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffece0);
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,pcVar1,&local_3e1);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffecc8,(int *)in_stack_ffffffffffffecc0);
      local_127a = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      if (local_127a) {
        std::__cxx11::ostringstream::ostringstream(local_560);
        poVar5 = std::operator<<((ostream *)local_560,"The argument for the -i option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"extract",&local_581);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_560);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1728::PrintUsage(in_stack_ffffffffffffece0);
      return 1;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffecc8,(int *)in_stack_ffffffffffffecc0);
      local_1222 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_1222) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"extract",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffecc8,(int *)in_stack_ffffffffffffecc0);
      local_124a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_124a) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar5 = std::operator<<((ostream *)local_398,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"extract",&local_3b9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
      local_14 = local_14 + 1;
    }
  }
  local_59c = local_8 - ya_optind;
  if (local_59c == 2) {
    local_590 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_598 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_59c != 1) {
      std::__cxx11::ostringstream::ostringstream(local_718);
      std::operator<<((ostream *)local_718,"Just two input files, idxfile and infile, are required")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"extract",&local_739);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_718);
      return local_4;
    }
    local_590 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_598 = (char *)0x0;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"extract",&local_8d9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b8);
    return local_4;
  }
  std::ifstream::ifstream(local_ae8);
  pcVar1 = local_590;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_ae8,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_c60);
    poVar5 = std::operator<<((ostream *)local_c60,"Cannot open file ");
    std::operator<<(poVar5,local_590);
    paVar6 = &local_c81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c80,"extract",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::__cxx11::string::~string(local_c80);
    std::allocator<char>::~allocator((allocator<char> *)&local_c81);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c60);
    goto LAB_001047a9;
  }
  local_c90 = local_ae8;
  std::ifstream::ifstream(local_e98);
  if (local_598 == (char *)0x0) {
LAB_001044b4:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_1318 = (char *)&std::cin;
    }
    else {
      local_1318 = local_e98;
    }
    local_1040 = local_1318;
    __n = (size_type)local_14;
    this = &local_1061;
    std::allocator<double>::allocator((allocator<double> *)0x10451a);
    std::vector<double,_std::allocator<double>_>::vector
              (this,__n,(allocator_type *)
                        CONCAT17(in_stack_ffffffffffffecd7,
                                 CONCAT16(in_stack_ffffffffffffecd6,
                                          CONCAT15(in_stack_ffffffffffffecd5,
                                                   CONCAT14(in_stack_ffffffffffffecd4,
                                                            in_stack_ffffffffffffecd0)))));
    std::allocator<double>::~allocator((allocator<double> *)0x104540);
    do {
      uVar4 = sptk::ReadStream<int>((int *)in_stack_ffffffffffffecc8,in_stack_ffffffffffffecc0);
      uVar7 = false;
      if ((bool)uVar4) {
        in_stack_ffffffffffffecd5 =
             sptk::ReadStream<double>
                       (SUB81((ulong)in_stack_ffffffffffffed10 >> 0x30,0),
                        (int)in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c,
                        in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,
                        in_stack_ffffffffffffecf8,in_stack_ffffffffffffed20);
        uVar7 = in_stack_ffffffffffffecd5;
      }
      if ((bool)uVar7 == false) {
        local_4 = 0;
        local_c88 = 1;
        goto LAB_0010476d;
      }
    } while ((local_1044 != local_18) ||
            (in_stack_ffffffffffffecd4 =
                  sptk::WriteStream<double>
                            ((int)in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c,
                             in_stack_ffffffffffffed00,(ostream *)in_stack_ffffffffffffecf8,
                             (int *)CONCAT17(bVar3,in_stack_ffffffffffffecf0)),
            (bool)in_stack_ffffffffffffecd4));
    std::__cxx11::ostringstream::ostringstream(local_11e0);
    std::operator<<((ostream *)local_11e0,"Failed to write extracted vector");
    paVar6 = &local_1201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1200,"extract",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::__cxx11::string::~string(local_1200);
    std::allocator<char>::~allocator((allocator<char> *)&local_1201);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11e0);
LAB_0010476d:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(uVar4,CONCAT16(uVar7,CONCAT15(in_stack_ffffffffffffecd5,
                                                      CONCAT14(in_stack_ffffffffffffecd4,
                                                               in_stack_ffffffffffffecd0)))));
  }
  else {
    in_stack_ffffffffffffed10 = local_598;
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_e98,(_Ios_Openmode)in_stack_ffffffffffffed10);
    bVar3 = std::ios::fail();
    in_stack_ffffffffffffed0c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffed0c);
    if ((bVar3 & 1) == 0) goto LAB_001044b4;
    std::__cxx11::ostringstream::ostringstream(local_1010);
    poVar5 = std::operator<<((ostream *)local_1010,"Cannot open file ");
    std::operator<<(poVar5,local_598);
    paVar6 = &local_1031;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1030,"extract",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::__cxx11::string::~string(local_1030);
    std::allocator<char>::~allocator((allocator<char> *)&local_1031);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1010);
  }
  std::ifstream::~ifstream(local_e98);
LAB_001047a9:
  std::ifstream::~ifstream(local_ae8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int codebook_index(kDefaultCodebookIndex);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:i:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &codebook_index) ||
            codebook_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* index_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    index_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    index_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, idxfile and infile, are required";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  // Open stream for reading index sequence.
  std::ifstream ifs1;
  ifs1.open(index_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << index_file;
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }
  std::istream& stream_for_index(ifs1);

  // Open stream for reading input sequence.
  std::ifstream ifs2;
  if (NULL != input_file) {
    ifs2.open(input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("extract", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input(ifs2.is_open() ? ifs2 : std::cin);

  int index;
  std::vector<double> input_vector(vector_length);

  while (sptk::ReadStream(&index, &stream_for_index) &&
         sptk::ReadStream(false, 0, 0, vector_length, &input_vector,
                          &stream_for_input, NULL)) {
    if (index == codebook_index) {
      if (!sptk::WriteStream(0, vector_length, input_vector, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write extracted vector";
        sptk::PrintErrorMessage("extract", error_message);
        return 1;
      }
    }
  }

  return 0;
}